

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * create_swizzle_abi_cxx11_(string *__return_storage_ptr__,MSLComponentSwizzle swizzle)

{
  CompilerError *this;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  MSLComponentSwizzle local_14;
  string *psStack_10;
  MSLComponentSwizzle swizzle_local;
  
  local_14 = swizzle;
  psStack_10 = __return_storage_ptr__;
  switch(swizzle) {
  case MSL_COMPONENT_SWIZZLE_IDENTITY:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"spvSwizzle::none",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case MSL_COMPONENT_SWIZZLE_ZERO:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"spvSwizzle::zero",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case MSL_COMPONENT_SWIZZLE_ONE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"spvSwizzle::one",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case MSL_COMPONENT_SWIZZLE_R:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"spvSwizzle::red",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case MSL_COMPONENT_SWIZZLE_G:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"spvSwizzle::green",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case MSL_COMPONENT_SWIZZLE_B:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"spvSwizzle::blue",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case MSL_COMPONENT_SWIZZLE_A:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"spvSwizzle::alpha",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  default:
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Invalid component swizzle.");
    __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,
                spirv_cross::CompilerError::~CompilerError);
  }
  return __return_storage_ptr__;
}

Assistant:

static string create_swizzle(MSLComponentSwizzle swizzle)
{
	switch (swizzle)
	{
	case MSL_COMPONENT_SWIZZLE_IDENTITY:
		return "spvSwizzle::none";
	case MSL_COMPONENT_SWIZZLE_ZERO:
		return "spvSwizzle::zero";
	case MSL_COMPONENT_SWIZZLE_ONE:
		return "spvSwizzle::one";
	case MSL_COMPONENT_SWIZZLE_R:
		return "spvSwizzle::red";
	case MSL_COMPONENT_SWIZZLE_G:
		return "spvSwizzle::green";
	case MSL_COMPONENT_SWIZZLE_B:
		return "spvSwizzle::blue";
	case MSL_COMPONENT_SWIZZLE_A:
		return "spvSwizzle::alpha";
	default:
		SPIRV_CROSS_THROW("Invalid component swizzle.");
	}
}